

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_mp3_read_pcm_frames_s16(ma_dr_mp3 *pMP3,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  long in_RDI;
  void *unaff_retaddr;
  undefined8 local_8;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x1a18) == 0)) {
    local_8 = 0;
  }
  else {
    local_8 = ma_dr_mp3_read_pcm_frames_raw
                        ((ma_dr_mp3 *)framesToRead,(ma_uint64)pBufferOut,unaff_retaddr);
  }
  return local_8;
}

Assistant:

MA_API ma_uint64 ma_dr_mp3_read_pcm_frames_s16(ma_dr_mp3* pMP3, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    if (pMP3 == NULL || pMP3->onRead == NULL) {
        return 0;
    }
#if !defined(MA_DR_MP3_FLOAT_OUTPUT)
    return ma_dr_mp3_read_pcm_frames_raw(pMP3, framesToRead, pBufferOut);
#else
    {
        float pTempF32[4096];
        ma_uint64 totalPCMFramesRead = 0;
        while (totalPCMFramesRead < framesToRead) {
            ma_uint64 framesJustRead;
            ma_uint64 framesRemaining = framesToRead - totalPCMFramesRead;
            ma_uint64 framesToReadNow = MA_DR_MP3_COUNTOF(pTempF32) / pMP3->channels;
            if (framesToReadNow > framesRemaining) {
                framesToReadNow = framesRemaining;
            }
            framesJustRead = ma_dr_mp3_read_pcm_frames_raw(pMP3, framesToReadNow, pTempF32);
            if (framesJustRead == 0) {
                break;
            }
            ma_dr_mp3_f32_to_s16((ma_int16*)MA_DR_MP3_OFFSET_PTR(pBufferOut, sizeof(ma_int16) * totalPCMFramesRead * pMP3->channels), pTempF32, framesJustRead * pMP3->channels);
            totalPCMFramesRead += framesJustRead;
        }
        return totalPCMFramesRead;
    }
#endif
}